

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void printTree(Node *node,int space)

{
  pointer pNVar1;
  ostream *poVar2;
  int iVar3;
  pointer node_00;
  nodekind local_74;
  Node local_70;
  
  iVar3 = space;
  if (0 < space) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  local_74 = node->kind;
  operator<<((ostream *)&std::cout,&local_74);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(node->value)._M_dataplus._M_p,
                      (node->value)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  node_00 = (node->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start;
  pNVar1 = (node->subnodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (node_00 != pNVar1) {
    do {
      Node::Node(&local_70,node_00);
      printTree(&local_70,space + 5);
      std::vector<Node,_std::allocator<Node>_>::~vector(&local_70.subnodes);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.value._M_dataplus._M_p != &local_70.value.field_2) {
        operator_delete(local_70.value._M_dataplus._M_p,
                        local_70.value.field_2._M_allocated_capacity + 1);
      }
      node_00 = node_00 + 1;
    } while (node_00 != pNVar1);
  }
  return;
}

Assistant:

void printTree(Node node, int space) {
    for (int i = 0; i < space; i++) {
        cout << " ";
    }
    cout << node.getKind() << " " << node.value << endl;
    for (const auto &n : node.subnodes) {
        printTree(n, space + 5);
    }
}